

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipaddr.c
# Opt level: O0

int main(void)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  test_v4();
  test_v6();
  test_cmp();
  printf("Test successful\n");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int main(void)
{
	test_v4();
	test_v6();
	test_cmp();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}